

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeT2Imm8S4(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus extraout_EAX;
  DecodeStatus extraout_EAX_00;
  uint uVar1;
  
  if (Val != 0) {
    uVar1 = -(Val & 0xff);
    if ((Val >> 8 & 1) != 0) {
      uVar1 = Val & 0xff;
    }
    MCOperand_CreateImm0(Inst,(long)(int)(uVar1 << 2));
    return extraout_EAX;
  }
  MCOperand_CreateImm0(Inst,-0x80000000);
  return extraout_EAX_00;
}

Assistant:

static DecodeStatus DecodeT2Imm8S4(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	if (Val == 0)
		MCOperand_CreateImm0(Inst, INT32_MIN);
	else {
		int imm = Val & 0xFF;

		if (!(Val & 0x100)) imm *= -1;
		MCOperand_CreateImm0(Inst, imm * 4);
	}

	return MCDisassembler_Success;
}